

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::TypedArraySort<unsigned_char>
               (uchar *list,uint32 length,CompareVarsInfo *cvInfo,ArenaAllocator *allocator)

{
  ThreadContext *threadContext;
  undefined1 local_50 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext;
  ArenaAllocator *allocator_local;
  CompareVarsInfo *cvInfo_local;
  uint32 length_local;
  uchar *list_local;
  
  jsReentLock._24_8_ = cvInfo->scriptContext;
  threadContext = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
  JsReentLock::JsReentLock((JsReentLock *)local_50,threadContext);
  if (length < 0x200) {
    JsReentLock::unlock((JsReentLock *)local_50);
    InsertionSort<unsigned_char>(list,length,cvInfo);
    JsReentLock::MutateArrayObject((JsReentLock *)local_50);
    JsReentLock::relock((JsReentLock *)local_50);
  }
  else {
    JsReentLock::unlock((JsReentLock *)local_50);
    MergeSort<unsigned_char>(list,length,cvInfo,allocator);
    JsReentLock::MutateArrayObject((JsReentLock *)local_50);
    JsReentLock::relock((JsReentLock *)local_50);
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_50);
  return;
}

Assistant:

void JavascriptArray::TypedArraySort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo, ArenaAllocator* allocator)
    {
        ScriptContext* scriptContext = cvInfo->scriptContext;
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        if (length < 512)
        {
            JS_REENTRANT(jsReentLock, JavascriptArray::InsertionSort<T>(list, length, cvInfo));
        }
        else
        {
            JS_REENTRANT(jsReentLock, JavascriptArray::MergeSort<T>(list, length, cvInfo, allocator));
        }
    }